

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O0

bool __thiscall anon_unknown.dwarf_32f1a0::Db::parseSeqId(Db *this,size_t *Out)

{
  char cVar1;
  size_t local_28;
  size_t Id;
  size_t *Out_local;
  Db *this_local;
  
  cVar1 = look(this,0);
  if (((cVar1 < '0') || (cVar1 = look(this,0), '9' < cVar1)) &&
     ((cVar1 = look(this,0), cVar1 < 'A' || (cVar1 = look(this,0), 'Z' < cVar1)))) {
    return true;
  }
  local_28 = 0;
  do {
    cVar1 = look(this,0);
    if ((cVar1 < '0') || (cVar1 = look(this,0), '9' < cVar1)) {
      cVar1 = look(this,0);
      if ((cVar1 < 'A') || (cVar1 = look(this,0), 'Z' < cVar1)) {
        *Out = local_28;
        return false;
      }
      cVar1 = look(this,0);
      local_28 = (long)(cVar1 + -0x41) + 10 + local_28 * 0x24;
    }
    else {
      cVar1 = look(this,0);
      local_28 = (long)(cVar1 + -0x30) + local_28 * 0x24;
    }
    this->First = this->First + 1;
  } while( true );
}

Assistant:

bool Db::parseSeqId(size_t *Out) {
  if (!(look() >= '0' && look() <= '9') &&
      !(look() >= 'A' && look() <= 'Z'))
    return true;

  size_t Id = 0;
  while (true) {
    if (look() >= '0' && look() <= '9') {
      Id *= 36;
      Id += static_cast<size_t>(look() - '0');
    } else if (look() >= 'A' && look() <= 'Z') {
      Id *= 36;
      Id += static_cast<size_t>(look() - 'A') + 10;
    } else {
      *Out = Id;
      return false;
    }
    ++First;
  }
}